

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O1

BOOL SHMInitialize(void)

{
  int block_size;
  int num_blocks;
  undefined1 *puVar1;
  SHMPTR SVar2;
  int *piVar3;
  SHMPTR first;
  long lVar4;
  SHMPTR *pSVar5;
  
  CCLock::Reset(&shm_critsec,false);
  if (PAL_InitializeChakraCoreCalled != false) {
    puVar1 = (undefined1 *)mmap64((void *)0x0,0x40000,3,0x22,-1,0);
    shm_segment_bases[0].m_val = puVar1;
    if (puVar1 == &DAT_ffffffffffffffff) {
      if (PAL_InitializeChakraCoreCalled != false) {
        piVar3 = __errno_location();
        strerror(*piVar3);
        return 0;
      }
    }
    else if (PAL_InitializeChakraCoreCalled != false) {
      lVar4 = 0;
      LOCK();
      *(undefined4 *)(puVar1 + 0x40) = 0;
      UNLOCK();
      memset(puVar1 + 0xa8,0,0x18);
      pSVar5 = (SHMPTR *)(puVar1 + 0x58);
      first = 0xc0;
      do {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00340a60;
        block_size = *(int *)((long)block_sizes + lVar4);
        num_blocks = (int)(0xffd0 / (long)block_size);
        SVar2 = SHMLinkPool(first,block_size,num_blocks);
        if (SVar2 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00340a60;
          SVar2 = 0;
        }
        else {
          *pSVar5 = first;
          *(int *)(pSVar5 + -1) = num_blocks;
          *(int *)(pSVar5 + -2) = block_size;
          *(int *)((long)pSVar5 + -0xc) = num_blocks;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00340a60;
        }
        if (SVar2 == 0) {
          if (PAL_InitializeChakraCoreCalled != false) {
            munmap(shm_segment_bases[0].m_val,0x40000);
            return 0;
          }
          goto LAB_00340a60;
        }
        *(SHMPTR *)(puVar1 + lVar4 * 2) = first;
        *(SHMPTR *)(puVar1 + lVar4 * 2 + 0x20) = SVar2;
        first = first + 0xffd0;
        lVar4 = lVar4 + 4;
        pSVar5 = pSVar5 + 3;
      } while (lVar4 != 0x10);
      if (PAL_InitializeChakraCoreCalled != false) {
        shm_numsegments = 1;
        lock_count = (Volatile<int>)0x0;
        locking_thread = (Volatile<void_*>)0x0;
        return 1;
      }
    }
  }
LAB_00340a60:
  abort();
}

Assistant:

BOOL SHMInitialize(void)
{
    shm_critsec.Reset();

    init_waste();

        int size;
        SHM_FIRST_HEADER *header;
        SHMPTR pool_start;
        SHMPTR pool_end;
        enum SHM_POOL_SIZES sps;

        TRACE("Now initializing global shared memory system\n");

        // Not really shared in CoreCLR; we don't try to talk to other CoreCLRs.
        shm_segment_bases[0] = mmap(NULL, segment_size,PROT_READ|PROT_WRITE,
                                    MAP_ANON|MAP_PRIVATE, -1, 0);
        if(shm_segment_bases[0] == MAP_FAILED)
        {
            ERROR("mmap() failed; error is %d (%s)\n", errno, strerror(errno));
            return FALSE;
        }
        TRACE("Mapped first SHM segment at %p\n",shm_segment_bases[0].Load());

        /* Initialize first segment's header */
        header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

        InterlockedExchange((LONG *)&header->spinlock, 0);

#ifdef TRACK_SHMLOCK_OWNERSHIP
        header->dwHeadCanaries[0] = HeadSignature;
        header->dwHeadCanaries[1] = HeadSignature;
        header->dwTailCanaries[0] = TailSignature;
        header->dwTailCanaries[1] = TailSignature;

        // Check spinlock size
        _ASSERTE(sizeof(DWORD) == sizeof(header->spinlock));
        // Check spinlock alignment
        _ASSERTE(0 == ((DWORD_PTR)&header->spinlock % (DWORD_PTR)sizeof(void *)));
#endif // TRACK_SHMLOCK_OWNERSHIP

#ifdef TRACK_SHMLOCK_OWNERSHIP
        header->pidtidCurrentOwner.pid = 0;
        header->pidtidCurrentOwner.tid = 0;
        memset((void *)header->pidtidOwners, 0, sizeof(header->pidtidOwners));
        header->ulOwnersIdx = 0;
#endif // TRACK_SHMLOCK_OWNERSHIP

        /* SHM information array starts with NULLs */
        memset((void *)header->shm_info, 0, SIID_LAST*sizeof(SHMPTR));

        /* Initialize memory pools */

        /* first pool starts right after header */
        pool_start = roundup(sizeof(SHM_FIRST_HEADER), sizeof(INT64));

        /* Same size for each pool, ensuring alignment is correct */
        size = ((segment_size-pool_start)/SPS_LAST) & ~(sizeof(INT64)-1);

        for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
             sps = static_cast<SHM_POOL_SIZES>(sps + 1))
        {
            pool_end = SHMInitPool(pool_start, block_sizes[sps], size,
                                   (SHM_POOL_INFO *)&header->pools[sps]);

            if(pool_end ==0)
            {
                ERROR("SHMInitPool failed.\n");
                munmap(shm_segment_bases[0],segment_size);
                return FALSE;
            }
            /* save first and last element of each pool for this segment */
            header->header.first_pool_blocks[sps] = pool_start;
            header->header.last_pool_blocks[sps] = pool_end;

            /* next pool starts immediately after this one */
            pool_start +=size;
        }

        TRACE("Global shared memory initialization complete.\n");

    shm_numsegments = 1;
    lock_count = 0;
    locking_thread = 0;

    /* hook into all SHM segments */
    if(!SHMMapUnknownSegments())
    {
        ERROR("Error while mapping segments!\n");
        SHMCleanup();
        return FALSE;
    }
    return TRUE;
}